

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

bool ImGui::TableNextColumn(void)

{
  ImGuiTable *pIVar1;
  bool bVar2;
  ImGuiTable *unaff_retaddr;
  int column_n;
  ImGuiTable *table;
  ImGuiContext *g;
  float in_stack_ffffffffffffffe0;
  ImGuiTableRowFlags in_stack_ffffffffffffffe4;
  int in_stack_fffffffffffffffc;
  
  pIVar1 = GImGui->CurrentTable;
  if (pIVar1 == (ImGuiTable *)0x0) {
    bVar2 = false;
  }
  else {
    if (((pIVar1->IsInsideRow & 1U) == 0) || (pIVar1->ColumnsCount <= pIVar1->CurrentColumn + 1)) {
      TableNextRow(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0);
      TableBeginCell(unaff_retaddr,in_stack_fffffffffffffffc);
    }
    else {
      if (pIVar1->CurrentColumn != -1) {
        TableEndCell((ImGuiTable *)GImGui);
      }
      TableBeginCell(unaff_retaddr,in_stack_fffffffffffffffc);
    }
    bVar2 = (pIVar1->RequestOutputMaskByIndex & 1L << ((byte)pIVar1->CurrentColumn & 0x3f)) != 0;
  }
  return bVar2;
}

Assistant:

bool ImGui::TableNextColumn()
{
    ImGuiContext& g = *GImGui;
    ImGuiTable* table = g.CurrentTable;
    if (!table)
        return false;

    if (table->IsInsideRow && table->CurrentColumn + 1 < table->ColumnsCount)
    {
        if (table->CurrentColumn != -1)
            TableEndCell(table);
        TableBeginCell(table, table->CurrentColumn + 1);
    }
    else
    {
        TableNextRow();
        TableBeginCell(table, 0);
    }

    // Return whether the column is visible. User may choose to skip submitting items based on this return value,
    // however they shouldn't skip submitting for columns that may have the tallest contribution to row height.
    int column_n = table->CurrentColumn;
    return (table->RequestOutputMaskByIndex & ((ImU64)1 << column_n)) != 0;
}